

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<std::__detail::_Node_iterator<unsigned_int,true,false>,std::__detail::_Node_iterator<unsigned_int,true,false>>&>
          (Fault *this,char *file,char line [7],Type code,char *condition,char *macroArgs,
          DebugComparison<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_std::__detail::_Node_iterator<unsigned_int,_true,_false>_>
          *params)

{
  char argValues [1] [7];
  Array<char> local_48;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<std::__detail::_Node_iterator<unsigned_int,true,false>,std::__detail::_Node_iterator<unsigned_int,true,false>>&>
            ((DebugComparison<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_std::__detail::_Node_iterator<unsigned_int,_true,_false>_>
              *)&local_48);
  init(this,(EVP_PKEY_CTX *)file);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}